

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O1

bool __thiscall
duckdb::RowGroupCollection::NextParallelScan
          (RowGroupCollection *this,ClientContext *context,ParallelCollectionScanState *state,
          CollectionScanState *scan_state)

{
  mutex *__mutex;
  ulong uVar1;
  __int_type _Var2;
  bool bVar3;
  int iVar4;
  ClientConfig *pCVar5;
  RowGroupSegmentTree *pRVar6;
  RowGroup *pRVar7;
  idx_t iVar8;
  lock_guard<std::mutex> l;
  RowGroup *unaff_R12;
  ulong uVar9;
  ulong unaff_R14;
  idx_t local_48;
  RowGroupCollection *local_38;
  
  __mutex = &state->lock;
  do {
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar4 != 0) goto LAB_017b54ac;
    iVar4 = 3;
    if ((state->current_row_group == (RowGroup *)0x0) ||
       ((state->current_row_group->super_SegmentBase<duckdb::RowGroup>).count.
        super___atomic_base<unsigned_long>._M_i == 0)) {
      bVar3 = false;
    }
    else {
      local_38 = state->collection;
      unaff_R12 = state->current_row_group;
      pCVar5 = ClientConfig::GetConfig(context);
      if (pCVar5->verify_parallelism == true) {
        local_48 = state->vector_index;
        uVar1 = (state->current_row_group->super_SegmentBase<duckdb::RowGroup>).count.
                super___atomic_base<unsigned_long>._M_i;
        uVar9 = state->vector_index * 0x800 + 0x800;
        if (uVar1 < uVar9) {
          uVar9 = uVar1;
        }
        uVar9 = uVar9 + (state->current_row_group->super_SegmentBase<duckdb::RowGroup>).start;
        iVar8 = state->vector_index + 1;
        state->vector_index = iVar8;
        if ((state->current_row_group->super_SegmentBase<duckdb::RowGroup>).count.
            super___atomic_base<unsigned_long>._M_i <= iVar8 * 0x800) {
          pRVar6 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
          pRVar7 = SegmentTree<duckdb::RowGroup,_true>::GetNextSegment
                             (&pRVar6->super_SegmentTree<duckdb::RowGroup,_true>,
                              state->current_row_group);
          state->current_row_group = pRVar7;
          state->vector_index = 0;
        }
      }
      else {
        LOCK();
        (state->processed_rows).super___atomic_base<unsigned_long>._M_i =
             (state->processed_rows).super___atomic_base<unsigned_long>._M_i +
             (state->current_row_group->super_SegmentBase<duckdb::RowGroup>).count.
             super___atomic_base<unsigned_long>._M_i;
        UNLOCK();
        iVar8 = (state->current_row_group->super_SegmentBase<duckdb::RowGroup>).start;
        _Var2 = (state->current_row_group->super_SegmentBase<duckdb::RowGroup>).count.
                super___atomic_base<unsigned_long>._M_i;
        pRVar6 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
        pRVar7 = SegmentTree<duckdb::RowGroup,_true>::GetNextSegment
                           (&pRVar6->super_SegmentTree<duckdb::RowGroup,_true>,
                            state->current_row_group);
        uVar9 = _Var2 + iVar8;
        state->current_row_group = pRVar7;
        local_48 = 0;
      }
      unaff_R14 = state->max_row;
      if (uVar9 < state->max_row) {
        unaff_R14 = uVar9;
      }
      iVar8 = state->batch_index + 1;
      state->batch_index = iVar8;
      scan_state->batch_index = iVar8;
      iVar4 = 0;
      bVar3 = true;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (bVar3) {
      bVar3 = InitializeScanInRowGroup(scan_state,local_38,unaff_R12,local_48,unaff_R14);
      iVar4 = 2 - (uint)bVar3;
    }
  } while (iVar4 == 2);
  if (iVar4 == 1) {
    bVar3 = true;
  }
  else {
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar4 != 0) {
LAB_017b54ac:
      ::std::__throw_system_error(iVar4);
    }
    scan_state->batch_index = state->batch_index;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool RowGroupCollection::NextParallelScan(ClientContext &context, ParallelCollectionScanState &state,
                                          CollectionScanState &scan_state) {
	while (true) {
		idx_t vector_index;
		idx_t max_row;
		RowGroupCollection *collection;
		RowGroup *row_group;
		{
			// select the next row group to scan from the parallel state
			lock_guard<mutex> l(state.lock);
			if (!state.current_row_group || state.current_row_group->count == 0) {
				// no more data left to scan
				break;
			}
			collection = state.collection;
			row_group = state.current_row_group;
			if (ClientConfig::GetConfig(context).verify_parallelism) {
				vector_index = state.vector_index;
				max_row = state.current_row_group->start +
				          MinValue<idx_t>(state.current_row_group->count,
				                          STANDARD_VECTOR_SIZE * state.vector_index + STANDARD_VECTOR_SIZE);
				D_ASSERT(vector_index * STANDARD_VECTOR_SIZE < state.current_row_group->count);
				state.vector_index++;
				if (state.vector_index * STANDARD_VECTOR_SIZE >= state.current_row_group->count) {
					state.current_row_group = row_groups->GetNextSegment(state.current_row_group);
					state.vector_index = 0;
				}
			} else {
				state.processed_rows += state.current_row_group->count;
				vector_index = 0;
				max_row = state.current_row_group->start + state.current_row_group->count;
				state.current_row_group = row_groups->GetNextSegment(state.current_row_group);
			}
			max_row = MinValue<idx_t>(max_row, state.max_row);
			scan_state.batch_index = ++state.batch_index;
		}
		D_ASSERT(collection);
		D_ASSERT(row_group);

		// initialize the scan for this row group
		bool need_to_scan = InitializeScanInRowGroup(scan_state, *collection, *row_group, vector_index, max_row);
		if (!need_to_scan) {
			// skip this row group
			continue;
		}
		return true;
	}
	lock_guard<mutex> l(state.lock);
	scan_state.batch_index = state.batch_index;
	return false;
}